

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minify_tests.c
# Opt level: O0

void cjson_minify_should_remove_single_line_comments(void)

{
  long lVar1;
  char *__dest;
  long in_FS_OFFSET;
  char *minified;
  char to_minify [61];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  memcpy(&minified,"{// this is {} \"some kind\" of [] comment /*, don\'t you see\n}",0x3d);
  __dest = (char *)malloc(0x3d);
  if (__dest == (char *)0x0) {
    UnityFail(" Expected Non-NULL",0x31);
  }
  strcpy(__dest,(char *)&minified);
  cJSON_Minify(__dest);
  UnityAssertEqualString("{}",__dest,(char *)0x0,0x35);
  free(__dest);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void cjson_minify_should_remove_single_line_comments(void)
{
    const char to_minify[] = "{// this is {} \"some kind\" of [] comment /*, don't you see\n}";

    char* minified = (char*) malloc(sizeof(to_minify));
    TEST_ASSERT_NOT_NULL(minified);
    strcpy(minified, to_minify);

    cJSON_Minify(minified);
    TEST_ASSERT_EQUAL_STRING("{}", minified);

    free(minified);
}